

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

void deqp::egl::logConfigAttribute(TestLog *log,EGLenum attrib,EGLint value)

{
  ostringstream *this;
  char *pcVar1;
  ConfigAttribValueFmt local_1a0;
  MessageBuilder local_198;
  
  this = &local_198.m_str;
  local_198.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"  ");
  pcVar1 = eglu::getConfigAttribName(attrib);
  std::operator<<((ostream *)this,pcVar1);
  std::operator<<((ostream *)this,": ");
  local_1a0.value = value;
  local_1a0.attribute = attrib;
  eglu::operator<<((ostream *)this,&local_1a0);
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

static void logConfigAttribute (TestLog& log, EGLenum attrib, EGLint value)
{
	log << TestLog::Message << "  " << eglu::getConfigAttribName(attrib) << ": " << eglu::getConfigAttribValueStr(attrib, value) << TestLog::EndMessage;
}